

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O0

SumVec * __thiscall Clasp::SharedMinimizeData::setOptimum(SharedMinimizeData *this,wsum_t *newOpt)

{
  __int_type _Var1;
  MinimizeMode MVar2;
  __atomic_base<unsigned_int> *in_RSI;
  SharedMinimizeData *in_RDI;
  SumVec *U;
  uint32 n;
  uint32 g;
  SumVec *last;
  __atomic_base<unsigned_int> *in_stack_ffffffffffffffc8;
  SumVec *local_8;
  
  if (in_RDI->optGen_ == 0) {
    _Var1 = std::__atomic_base::operator_cast_to_unsigned_int(in_stack_ffffffffffffffc8);
    local_8 = in_RDI->up_ + (1 - (_Var1 & 1));
    last = local_8;
    numRules((SharedMinimizeData *)0x1ad5d5);
    bk_lib::pod_vector<long,std::allocator<long>>::assign<long_const*>
              (&in_RDI->adjust_,(long *)in_RSI,(long *)last);
    _Var1 = (__int_type)((ulong)last >> 0x20);
    MVar2 = mode(in_RDI);
    if (MVar2 != enumerate) {
      std::__atomic_base<unsigned_int>::operator=(in_RSI,_Var1);
    }
  }
  else {
    local_8 = in_RDI->up_ + (in_RDI->optGen_ & 1);
  }
  return local_8;
}

Assistant:

const SumVec* SharedMinimizeData::setOptimum(const wsum_t* newOpt) {
	if (optGen_) { return up_ + (optGen_&1u); }
	uint32  g = gCount_;
	uint32  n = 1u - (g & 1u);
	SumVec& U = up_[n];
	U.assign(newOpt, newOpt + numRules());
	assert(mode() != MinimizeMode_t::enumerate || n == 1);
	if (mode() != MinimizeMode_t::enumerate) {
		if (++g == 0) { g = 2; }
		gCount_  = g;
	}
	return &U;
}